

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecIso.c
# Opt level: O2

int Gia_ManIsoEqual(int Id0,int Id1,uint *pStore,int nWords)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 == 2) {
      return 1;
    }
    lVar1 = Id0 * 2 + lVar3;
    lVar2 = Id1 * 2 + lVar3;
    lVar3 = lVar3 + 1;
  } while (pStore[lVar1] == pStore[lVar2]);
  return 0;
}

Assistant:

static inline int Gia_ManIsoEqual( int Id0, int Id1, unsigned * pStore, int nWords )
{
    unsigned * pInfo0 = Cec_ManIsoInfo( pStore, nWords, Id0 );
    unsigned * pInfo1 = Cec_ManIsoInfo( pStore, nWords, Id1 );
    int w;
    for ( w = 0; w < nWords; w++ )
        if ( pInfo0[w] != pInfo1[w] )
            return 0;
    return 1;
}